

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O0

int __thiscall
vkt::DynamicState::DynamicStateRSTests::init(DynamicStateRSTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  int extraout_EAX;
  mapped_type *ppcVar2;
  InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBiasParamTestInstance> *this_00;
  InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBiasClampParamTestInstance>
  *this_01;
  InstanceFactory<vkt::DynamicState::(anonymous_namespace)::LineWidthParamTestInstance> *this_02;
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_1e8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  undefined1 local_161;
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_160;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  undefined1 local_d9;
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_d8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  key_type local_58 [5];
  key_type local_44;
  undefined1 local_40 [8];
  ShaderMap shaderPaths;
  DynamicStateRSTests *this_local;
  
  shaderPaths._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::map((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
         *)local_40);
  local_44 = SHADERTYPE_VERTEX;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_40,&local_44);
  *ppcVar2 = "vulkan/dynamic_state/VertexFetch.vert";
  local_58[0] = SHADERTYPE_FRAGMENT;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_40,local_58);
  *ppcVar2 = "vulkan/dynamic_state/VertexFetch.frag";
  this_00 = (InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBiasParamTestInstance> *
            )operator_new(0xa0);
  local_d9 = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"depth_bias",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Test depth bias functionality",&local_a1);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::map(&local_d8,
        (map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
         *)local_40);
  InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBiasParamTestInstance>::
  InstanceFactory(this_00,pTVar1,&local_78,&local_a0,&local_d8);
  local_d9 = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~map(&local_d8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  this_01 = (InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBiasClampParamTestInstance>
             *)operator_new(0xa0);
  local_161 = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"depth_bias_clamp",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"Test depth bias clamp functionality",&local_129);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::map(&local_160,
        (map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
         *)local_40);
  InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBiasClampParamTestInstance>::
  InstanceFactory(this_01,pTVar1,&local_100,&local_128,&local_160);
  local_161 = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~map(&local_160);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  this_02 = (InstanceFactory<vkt::DynamicState::(anonymous_namespace)::LineWidthParamTestInstance> *
            )operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"line_width",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Draw a line with width set to max defined by physical device",
             &local_1b1);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::map(&local_1e8,
        (map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
         *)local_40);
  InstanceFactory<vkt::DynamicState::(anonymous_namespace)::LineWidthParamTestInstance>::
  InstanceFactory(this_02,pTVar1,&local_188,&local_1b0,&local_1e8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~map(&local_1e8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::
  map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~map((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
          *)local_40);
  return extraout_EAX;
}

Assistant:

void DynamicStateRSTests::init (void)
{
	ShaderMap shaderPaths;
	shaderPaths[glu::SHADERTYPE_VERTEX]		= "vulkan/dynamic_state/VertexFetch.vert";
	shaderPaths[glu::SHADERTYPE_FRAGMENT]	= "vulkan/dynamic_state/VertexFetch.frag";

	addChild(new InstanceFactory<DepthBiasParamTestInstance>(m_testCtx, "depth_bias", "Test depth bias functionality", shaderPaths));
	addChild(new InstanceFactory<DepthBiasClampParamTestInstance>(m_testCtx, "depth_bias_clamp", "Test depth bias clamp functionality", shaderPaths));
	addChild(new InstanceFactory<LineWidthParamTestInstance>(m_testCtx, "line_width", "Draw a line with width set to max defined by physical device", shaderPaths));
}